

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GroupAssignmentRecord *this)

{
  ostream *poVar1;
  char cVar2;
  ulong uVar3;
  KString local_380;
  string local_360 [32];
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"Group Assignment Record");
  poVar1 = std::operator<<(poVar1,"\nGroup Bit Field:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"Entity ID:\n");
  EntityIdentifier::GetAsString_abi_cxx11_(&local_380,&this->m_Entity);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xffff;
    if (local_380._M_string_length <= uVar3) break;
    cVar2 = local_380._M_dataplus._M_p[uVar3];
    if (local_380._M_string_length - 1 != uVar3 && cVar2 == '\n') {
      cVar2 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar2);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  poVar1 = std::operator<<(poVar1,local_360);
  poVar1 = std::operator<<(poVar1,"Communication Device ID:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16DstCommsDvcID);
  poVar1 = std::operator<<(poVar1,"\nLine ID:                 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DstLineID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString GroupAssignmentRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Group Assignment Record"
       << "\nGroup Bit Field:         " << m_ui32GrpBtField
       << "Entity ID:\n"                << IndentString( m_Entity.GetAsString(), 1 )
       << "Communication Device ID:   " << m_ui16DstCommsDvcID
       << "\nLine ID:                 " << ( KUINT16 )m_ui8DstLineID
       << "\n";

    return ss.str();
}